

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBGrayRow_SSSE3(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  bool bVar1;
  char cVar2;
  byte bVar10;
  undefined1 auVar18 [14];
  undefined1 auVar19 [12];
  unkbyte10 Var20;
  undefined1 auVar21 [14];
  undefined1 auVar22 [12];
  unkbyte10 Var23;
  unkbyte9 Var24;
  unkbyte9 Var25;
  undefined6 uVar26;
  undefined4 uVar27;
  undefined6 uVar28;
  undefined4 uVar29;
  undefined2 uVar30;
  uvec16 auVar31;
  uvec8 auVar32;
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ushort uVar36;
  ushort uVar37;
  ushort uVar43;
  ushort uVar45;
  ushort uVar47;
  ushort uVar49;
  ushort uVar51;
  ushort uVar53;
  undefined1 auVar38 [16];
  ushort uVar44;
  ushort uVar46;
  ushort uVar48;
  ushort uVar50;
  ushort uVar52;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar39 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  auVar32 = libyuv::kARGBToYJ;
  auVar31 = libyuv::kSub128;
  do {
    auVar34[0] = *src_argb - (char)auVar31[0];
    auVar34[1] = src_argb[1] - auVar31[0]._1_1_;
    auVar34[2] = src_argb[2] - (char)auVar31[1];
    auVar34[3] = src_argb[3] - auVar31[1]._1_1_;
    auVar34[4] = src_argb[4] - (char)auVar31[2];
    auVar34[5] = src_argb[5] - auVar31[2]._1_1_;
    auVar34[6] = src_argb[6] - (char)auVar31[3];
    auVar34[7] = src_argb[7] - auVar31[3]._1_1_;
    auVar34[8] = src_argb[8] - (char)auVar31[4];
    auVar34[9] = src_argb[9] - auVar31[4]._1_1_;
    auVar34[10] = src_argb[10] - (char)auVar31[5];
    auVar34[0xb] = src_argb[0xb] - auVar31[5]._1_1_;
    auVar34[0xc] = src_argb[0xc] - (char)auVar31[6];
    auVar34[0xd] = src_argb[0xd] - auVar31[6]._1_1_;
    auVar34[0xe] = src_argb[0xe] - (char)auVar31[7];
    auVar34[0xf] = src_argb[0xf] - auVar31[7]._1_1_;
    auVar35[0] = src_argb[0x10] - (char)auVar31[0];
    auVar35[1] = src_argb[0x11] - auVar31[0]._1_1_;
    auVar35[2] = src_argb[0x12] - (char)auVar31[1];
    auVar35[3] = src_argb[0x13] - auVar31[1]._1_1_;
    auVar35[4] = src_argb[0x14] - (char)auVar31[2];
    auVar35[5] = src_argb[0x15] - auVar31[2]._1_1_;
    auVar35[6] = src_argb[0x16] - (char)auVar31[3];
    auVar35[7] = src_argb[0x17] - auVar31[3]._1_1_;
    auVar35[8] = src_argb[0x18] - (char)auVar31[4];
    auVar35[9] = src_argb[0x19] - auVar31[4]._1_1_;
    auVar35[10] = src_argb[0x1a] - (char)auVar31[5];
    auVar35[0xb] = src_argb[0x1b] - auVar31[5]._1_1_;
    auVar35[0xc] = src_argb[0x1c] - (char)auVar31[6];
    auVar35[0xd] = src_argb[0x1d] - auVar31[6]._1_1_;
    auVar35[0xe] = src_argb[0x1e] - (char)auVar31[7];
    auVar35[0xf] = src_argb[0x1f] - auVar31[7]._1_1_;
    auVar38 = pmaddubsw((undefined1  [16])auVar32,auVar34);
    auVar34 = pmaddubsw((undefined1  [16])auVar32,auVar35);
    auVar34 = phaddw(auVar38,auVar34);
    uVar36 = auVar34._0_2_ + auVar31[0];
    uVar43 = auVar34._2_2_ + auVar31[1];
    uVar45 = auVar34._4_2_ + auVar31[2];
    uVar47 = auVar34._6_2_ + auVar31[3];
    uVar49 = auVar34._8_2_ + auVar31[4];
    uVar51 = auVar34._10_2_ + auVar31[5];
    uVar53 = auVar34._12_2_ + auVar31[6];
    uVar55 = auVar34._14_2_ + auVar31[7];
    uVar37 = uVar36 >> 8;
    uVar44 = uVar43 >> 8;
    uVar46 = uVar45 >> 8;
    uVar48 = uVar47 >> 8;
    uVar50 = uVar49 >> 8;
    uVar52 = uVar51 >> 8;
    uVar54 = uVar53 >> 8;
    uVar56 = uVar55 >> 8;
    cVar2 = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37);
    cVar3 = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
    cVar4 = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46);
    cVar5 = (uVar48 != 0) * (uVar48 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar48);
    cVar6 = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
    cVar7 = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar51 >> 8) - (0xff < uVar52);
    cVar8 = (uVar54 != 0) * (uVar54 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar54);
    cVar9 = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    bVar10 = src_argb[3];
    bVar11 = src_argb[7];
    bVar12 = src_argb[0xb];
    bVar13 = src_argb[0xf];
    bVar14 = src_argb[0x13];
    bVar15 = src_argb[0x17];
    bVar16 = src_argb[0x1b];
    bVar17 = src_argb[0x1f];
    src_argb = src_argb + 0x20;
    bVar10 = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    bVar11 = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
    bVar12 = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
    bVar13 = (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13);
    bVar14 = (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14);
    bVar15 = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    bVar16 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    bVar17 = (bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17);
    uVar27 = CONCAT31(CONCAT21(CONCAT11(cVar9,cVar9),cVar8),cVar8);
    uVar26 = CONCAT51(CONCAT41(uVar27,cVar7),cVar7);
    Var24 = CONCAT72(CONCAT61(uVar26,cVar6),CONCAT11(cVar6,cVar9));
    Var20 = CONCAT91(CONCAT81((long)((unkuint9)Var24 >> 8),cVar5),cVar5);
    auVar19._2_10_ = Var20;
    auVar19[1] = cVar4;
    auVar19[0] = cVar4;
    auVar18._2_12_ = auVar19;
    auVar18[1] = cVar3;
    auVar18[0] = cVar3;
    auVar38._0_2_ = CONCAT11(cVar2,cVar2);
    auVar38._2_14_ = auVar18;
    uVar30 = CONCAT11((bVar17 != 0) * (bVar17 < 0x100) * bVar17 - (0xff < bVar17),cVar9);
    uVar29 = CONCAT31(CONCAT21(uVar30,(bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16)),
                      cVar8);
    uVar28 = CONCAT51(CONCAT41(uVar29,(bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15)),
                      cVar7);
    Var25 = CONCAT72(CONCAT61(uVar28,(bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14)),
                     CONCAT11(cVar6,cVar9));
    Var23 = CONCAT91(CONCAT81((long)((unkuint9)Var25 >> 8),
                              (bVar13 != 0) * (bVar13 < 0x100) * bVar13 - (0xff < bVar13)),cVar5);
    auVar22._2_10_ = Var23;
    auVar22[1] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
    auVar22[0] = cVar4;
    auVar21._2_12_ = auVar22;
    auVar21[1] = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
    auVar21[0] = cVar3;
    auVar39[3] = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    auVar39[2] = cVar2;
    auVar42._0_12_ = auVar38._0_12_;
    auVar42._12_2_ = (short)Var20;
    auVar42._14_2_ = (short)Var23;
    auVar41._12_4_ = auVar42._12_4_;
    auVar41._0_10_ = auVar38._0_10_;
    auVar41._10_2_ = auVar22._0_2_;
    auVar40._10_6_ = auVar41._10_6_;
    auVar40._0_8_ = auVar38._0_8_;
    auVar40._8_2_ = auVar19._0_2_;
    auVar39._8_8_ = auVar40._8_8_;
    auVar39._6_2_ = auVar21._0_2_;
    auVar39._4_2_ = auVar18._0_2_;
    auVar39._0_2_ = auVar38._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar39;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var24 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var25 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar26;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)uVar28;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar27;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) = (short)uVar29;
    *(ushort *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = CONCAT11(cVar9,cVar9);
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = uVar30;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar33 = width + -8;
    bVar1 = 7 < width;
    width = iVar33;
  } while (iVar33 != 0 && bVar1);
  return;
}

Assistant:

void ARGBGrayRow_SSSE3(const uint8_t* src_argb, uint8_t* dst_argb, int width) {
  asm volatile(
      "movdqa      %3,%%xmm4                     \n"
      "movdqa      %4,%%xmm5                     \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "psubb       %%xmm5,%%xmm0                 \n"
      "psubb       %%xmm5,%%xmm1                 \n"
      "movdqu      %%xmm4,%%xmm6                 \n"
      "pmaddubsw   %%xmm0,%%xmm6                 \n"
      "movdqu      %%xmm4,%%xmm0                 \n"
      "pmaddubsw   %%xmm1,%%xmm0                 \n"
      "phaddw      %%xmm0,%%xmm6                 \n"
      "paddw       %%xmm5,%%xmm6                 \n"
      "psrlw       $0x8,%%xmm6                   \n"
      "packuswb    %%xmm6,%%xmm6                 \n"
      "movdqu      (%0),%%xmm2                   \n"
      "movdqu      0x10(%0),%%xmm3               \n"
      "lea         0x20(%0),%0                   \n"
      "psrld       $0x18,%%xmm2                  \n"
      "psrld       $0x18,%%xmm3                  \n"
      "packuswb    %%xmm3,%%xmm2                 \n"
      "packuswb    %%xmm2,%%xmm2                 \n"
      "movdqa      %%xmm6,%%xmm3                 \n"
      "punpcklbw   %%xmm6,%%xmm6                 \n"
      "punpcklbw   %%xmm2,%%xmm3                 \n"
      "movdqa      %%xmm6,%%xmm1                 \n"
      "punpcklwd   %%xmm3,%%xmm6                 \n"
      "punpckhwd   %%xmm3,%%xmm1                 \n"
      "movdqu      %%xmm6,(%1)                   \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_argb),  // %1
        "+r"(width)      // %2
      : "m"(kARGBToYJ),  // %3
        "m"(kSub128)     // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}